

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::
         StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         ::convert(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  IContext *pIVar4;
  undefined4 extraout_var;
  element_type *peVar5;
  reference pcVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_60;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *str_local;
  string *s;
  
  local_18 = str;
  str_local = __return_storage_ptr__;
  pIVar4 = getCurrentContext();
  iVar2 = (*pIVar4->_vptr_IContext[4])();
  peVar5 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(extraout_var,iVar2));
  uVar3 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[10])();
  if ((uVar3 & 1) == 0) {
    std::operator+(&local_38,'\"',local_18);
    std::operator+(__return_storage_ptr__,&local_38,'\"');
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    __range1._3_1_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"\"",(allocator *)((long)&__range1 + 2));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 2));
    __end1._M_current = (char *)std::__cxx11::string::begin();
    _Stack_60._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa0), bVar1) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
      if (*pcVar6 == '\t') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else if (*pcVar6 == '\n') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<std::string>::convert(const std::string& str) {
    if (!getCurrentContext().getConfig()->showInvisibles()) {
        return '"' + str + '"';
    }

    std::string s("\"");
    for (char c : str) {
        switch (c) {
        case '\n':
            s.append("\\n");
            break;
        case '\t':
            s.append("\\t");
            break;
        default:
            s.push_back(c);
            break;
        }
    }
    s.append("\"");
    return s;
}